

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

MidiEvent * __thiscall
smf::MidiFile::addPitchBend(MidiFile *this,int aTrack,int aTick,int aChannel,double amount)

{
  uint uVar1;
  MidiEvent *pMVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mididata;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  this->m_timemapvalid = false;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_38,3);
  uVar1 = (uint)((amount + 1.0) * 8192.0 + 0.5);
  uVar3 = 0x3fff;
  if ((int)uVar1 < 0x3fff) {
    uVar3 = uVar1;
  }
  uVar1 = 0;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  iVar4 = 0xf;
  if (aChannel < 0xf) {
    iVar4 = aChannel;
  }
  bVar5 = 0xe0;
  if (-1 < aChannel) {
    bVar5 = (byte)iVar4 | 0xe0;
  }
  *local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = bVar5;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (byte)uVar1 & 0x7f;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = (byte)(uVar1 >> 7);
  pMVar2 = addEvent(this,aTrack,aTick,&local_38);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pMVar2;
}

Assistant:

MidiEvent* MidiFile::addPitchBend(int aTrack, int aTick, int aChannel, double amount) {
	m_timemapvalid = 0;
	amount += 1.0;
	int value = int(amount * 8192 + 0.5);

	// prevent any wrap-around in case of round-off errors
	if (value > 0x3fff) {
		value = 0x3fff;
	}
	if (value < 0) {
		value = 0;
	}

	int lsbint = 0x7f & value;
	int msbint = 0x7f & (value  >> 7);

	std::vector<uchar> mididata;
	mididata.resize(3);
	if (aChannel < 0) {
		aChannel = 0;
	} else if (aChannel > 15) {
		aChannel = 15;
	}
	mididata[0] = uchar(0xe0 | aChannel);
	mididata[1] = uchar(lsbint);
	mididata[2] = uchar(msbint);

	return addEvent(aTrack, aTick, mididata);
}